

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O3

type * __thiscall
duckdb::Deserializer::
Read<std::map<duckdb::LogicalTypeId,duckdb::CSVOption<duckdb::StrpTimeFormat>,std::less<duckdb::LogicalTypeId>,std::allocator<std::pair<duckdb::LogicalTypeId_const,duckdb::CSVOption<duckdb::StrpTimeFormat>>>>>
          (type *__return_storage_ptr__,Deserializer *this)

{
  _Rb_tree_header *p_Var1;
  LogicalTypeId LVar2;
  int iVar3;
  undefined4 extraout_var;
  mapped_type *pmVar4;
  long lVar5;
  LogicalTypeId key;
  CSVOption<duckdb::StrpTimeFormat> value;
  LogicalTypeId local_b1;
  CSVOption<duckdb::StrpTimeFormat> local_b0;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  iVar3 = (*this->_vptr_Deserializer[8])(this);
  lVar5 = CONCAT44(extraout_var,iVar3);
  if (lVar5 != 0) {
    do {
      (*this->_vptr_Deserializer[6])(this);
      (*this->_vptr_Deserializer[2])(this,0,"key");
      if (this->deserialize_enum_from_string == true) {
        (*this->_vptr_Deserializer[0x1a])(&local_b0,this);
        LVar2 = EnumUtil::FromString<duckdb::LogicalTypeId>
                          ((char *)CONCAT71(local_b0._1_7_,local_b0.set_by_user));
        if ((string *)CONCAT71(local_b0._1_7_,local_b0.set_by_user) !=
            &local_b0.value.super_StrTimeFormat.format_specifier) {
          operator_delete((undefined1 *)CONCAT71(local_b0._1_7_,local_b0.set_by_user));
        }
      }
      else {
        iVar3 = (*this->_vptr_Deserializer[0xf])(this);
        LVar2 = (LogicalTypeId)iVar3;
      }
      (*this->_vptr_Deserializer[3])(this);
      local_b1 = LVar2;
      (*this->_vptr_Deserializer[2])(this,1,"value");
      (*this->_vptr_Deserializer[6])(this);
      CSVOption<duckdb::StrpTimeFormat>::Deserialize(&local_b0,this);
      (*this->_vptr_Deserializer[7])(this);
      (*this->_vptr_Deserializer[3])(this);
      (*this->_vptr_Deserializer[7])(this);
      pmVar4 = ::std::
               map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
               ::operator[](__return_storage_ptr__,&local_b1);
      pmVar4->set_by_user = local_b0.set_by_user;
      ::std::__cxx11::string::_M_assign
                ((string *)&(pmVar4->value).super_StrTimeFormat.format_specifier);
      ::std::vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>::operator=
                (&(pmVar4->value).super_StrTimeFormat.specifiers.
                  super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>,
                 &local_b0.value.super_StrTimeFormat.specifiers.
                  super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>)
      ;
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&(pmVar4->value).super_StrTimeFormat.literals,
                  &local_b0.value.super_StrTimeFormat.literals.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 );
      (pmVar4->value).super_StrTimeFormat.constant_size =
           local_b0.value.super_StrTimeFormat.constant_size;
      ::std::vector<int,_std::allocator<int>_>::operator=
                (&(pmVar4->value).super_StrTimeFormat.numeric_width.
                  super_vector<int,_std::allocator<int>_>,
                 &local_b0.value.super_StrTimeFormat.numeric_width.
                  super_vector<int,_std::allocator<int>_>);
      StrTimeFormat::~StrTimeFormat(&local_b0.value.super_StrTimeFormat);
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  (*this->_vptr_Deserializer[9])(this);
  return __return_storage_ptr__;
}

Assistant:

inline typename std::enable_if<is_map<T>::value, T>::type Read() {
		using KEY_TYPE = typename is_map<T>::KEY_TYPE;
		using VALUE_TYPE = typename is_map<T>::VALUE_TYPE;

		T map;
		auto size = OnListBegin();
		for (idx_t i = 0; i < size; i++) {
			OnObjectBegin();
			auto key = ReadProperty<KEY_TYPE>(0, "key");
			auto value = ReadProperty<VALUE_TYPE>(1, "value");
			OnObjectEnd();
			map[std::move(key)] = std::move(value);
		}
		OnListEnd();
		return map;
	}